

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O3

void __thiscall MarkerIndex::Iterator::reset(Iterator *this)

{
  Node *pNVar1;
  pointer pPVar2;
  Point in_RAX;
  Point local_18;
  
  pNVar1 = this->marker_index->root;
  this->current_node = pNVar1;
  if (pNVar1 != (Node *)0x0) {
    this->current_node_position = pNVar1->left_extent;
  }
  local_18 = in_RAX;
  Point::Point(&local_18,0,0);
  this->left_ancestor_position = local_18;
  Point::Point(&local_18,0xffffffff,0xffffffff);
  this->right_ancestor_position = local_18;
  pPVar2 = (this->left_ancestor_position_stack).super__Vector_base<Point,_std::allocator<Point>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->left_ancestor_position_stack).super__Vector_base<Point,_std::allocator<Point>_>._M_impl
      .super__Vector_impl_data._M_finish != pPVar2) {
    (this->left_ancestor_position_stack).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
    super__Vector_impl_data._M_finish = pPVar2;
  }
  pPVar2 = (this->right_ancestor_position_stack).super__Vector_base<Point,_std::allocator<Point>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->right_ancestor_position_stack).super__Vector_base<Point,_std::allocator<Point>_>.
      _M_impl.super__Vector_impl_data._M_finish != pPVar2) {
    (this->right_ancestor_position_stack).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
    super__Vector_impl_data._M_finish = pPVar2;
  }
  return;
}

Assistant:

void MarkerIndex::Iterator::reset() {
  current_node = marker_index->root;
  if (current_node) {
    current_node_position = current_node->left_extent;
  }
  left_ancestor_position = Point(0, 0);
  right_ancestor_position = Point(UINT32_MAX, UINT32_MAX);
  left_ancestor_position_stack.clear();
  right_ancestor_position_stack.clear();
}